

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O2

Value * __thiscall flow::IRBuilder::createB2S(IRBuilder *this,Value *rhs,string *name)

{
  long lVar1;
  ConstantString *pCVar2;
  char *__s;
  LiteralType local_4c;
  Value *local_48;
  string local_40;
  
  local_48 = rhs;
  if (rhs->type_ == Boolean) {
    lVar1 = __dynamic_cast(rhs,&Value::typeinfo,&ConstantValue<bool,(flow::LiteralType)1>::typeinfo,
                           0);
    if (lVar1 == 0) {
      local_4c = String;
      makeName(&local_40,this,name);
      pCVar2 = (ConstantString *)
               insert<flow::CastInstr,flow::LiteralType,flow::Value*&,std::__cxx11::string>
                         (this,&local_4c,&local_48,&local_40);
    }
    else {
      __s = "false";
      if (*(char *)(lVar1 + 0x48) != '\0') {
        __s = "true";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,__s,(allocator<char> *)&local_4c);
      pCVar2 = get(this,&local_40);
    }
    std::__cxx11::string::~string((string *)&local_40);
    return (Value *)pCVar2;
  }
  __assert_fail("rhs->type() == LiteralType::Boolean",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0x23d,"Value *flow::IRBuilder::createB2S(Value *, const std::string &)");
}

Assistant:

Value* IRBuilder::createB2S(Value* rhs, const std::string& name) {
  assert(rhs->type() == LiteralType::Boolean);

  if (auto a = dynamic_cast<ConstantBoolean*>(rhs))
    return get(a->get() ? "true" : "false");

  return insert<CastInstr>(LiteralType::String, rhs, makeName(name));
}